

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_varint_to_bytes(uint64_t value,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t sVar2;
  ulong uStack_10;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (bytes_out != (uchar *)0x0) {
    if (value < 0xfd) {
      uStack_10 = 1;
    }
    else if (value < 0x10000) {
      uStack_10 = 3;
    }
    else {
      uStack_10 = (ulong)(value >> 0x20 != 0) * 4 + 5;
    }
    if ((written != (size_t *)0x0) && (uStack_10 <= len)) {
      sVar2 = varint_to_bytes(value,bytes_out);
      *written = sVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_varint_to_bytes(uint64_t value, unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (!bytes_out || len < varint_get_length(value) || !written)
        return WALLY_EINVAL;
    *written = varint_to_bytes(value, bytes_out);
    return WALLY_OK;
}